

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtphashtable.h
# Opt level: O3

void __thiscall
jrtplib::RTPHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>::
~RTPHashTable(RTPHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
              *this)

{
  HashElement *pHVar1;
  RTPMemoryManager *pRVar2;
  HashElement *pHVar3;
  
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__RTPHashTable_001443c8;
  memset(this->table,0,0x103e8);
  pHVar3 = this->firsthashelem;
  while (pHVar3 != (HashElement *)0x0) {
    pHVar1 = pHVar3->listnext;
    pRVar2 = (this->super_RTPMemoryObject).mgr;
    if (pRVar2 == (RTPMemoryManager *)0x0) {
      operator_delete(pHVar3,0x28);
      pHVar3 = pHVar1;
    }
    else {
      (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2,pHVar3);
      pHVar3 = pHVar1;
    }
  }
  this->firsthashelem = (HashElement *)0x0;
  this->lasthashelem = (HashElement *)0x0;
  return;
}

Assistant:

~RTPHashTable()						{ Clear(); }